

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O1

void __thiscall slang::ast::Scope::reportNameConflict(Scope *this,Symbol *member,Symbol *existing)

{
  bool bVar1;
  Type *this_00;
  Type *this_01;
  Diagnostic *this_02;
  Diagnostic *pDVar2;
  
  bVar1 = Symbol::isValue(existing);
  if (bVar1) {
    bVar1 = Symbol::isValue(member);
    if (bVar1) {
      this_00 = DeclaredType::getType((DeclaredType *)(member + 1));
      this_01 = DeclaredType::getType((DeclaredType *)(existing + 1));
      if (this_00->canonical == (Type *)0x0) {
        Type::resolveCanonical(this_00);
      }
      if ((this_00->canonical->super_Symbol).kind != ErrorType) {
        if (this_01->canonical == (Type *)0x0) {
          Type::resolveCanonical(this_01);
        }
        if ((this_01->canonical->super_Symbol).kind != ErrorType) {
          bVar1 = Type::isMatching(this_00,this_01);
          if (!bVar1) {
            this_02 = addDiag(this,(DiagCode)0x2b000a,member->location);
            pDVar2 = Diagnostic::operator<<(this_02,member->name);
            pDVar2 = ast::operator<<(pDVar2,this_00);
            ast::operator<<(pDVar2,this_01);
            goto LAB_002eb091;
          }
        }
      }
    }
  }
  this_02 = addDiag(this,(DiagCode)0x2a000a,member->location);
  Diagnostic::operator<<(this_02,member->name);
LAB_002eb091:
  Diagnostic::addNote(this_02,(DiagCode)0xa0001,existing->location);
  return;
}

Assistant:

void Scope::reportNameConflict(const Symbol& member, const Symbol& existing) const {
    Diagnostic* diag;
    if (existing.isValue() && member.isValue()) {
        const Type& memberType = member.as<ValueSymbol>().getType();
        const Type& existingType = existing.as<ValueSymbol>().getType();

        if (memberType.isError() || existingType.isError() || memberType.isMatching(existingType)) {
            diag = &addDiag(diag::Redefinition, member.location);
            (*diag) << member.name;
        }
        else {
            diag = &addDiag(diag::RedefinitionDifferentType, member.location);
            (*diag) << member.name << memberType << existingType;
        }
    }
    else {
        diag = &addDiag(diag::Redefinition, member.location);
        (*diag) << member.name;
    }
    diag->addNote(diag::NotePreviousDefinition, existing.location);
}